

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.c
# Opt level: O2

CURLcode curlx_base64_decode(char *src,uchar **outptr,size_t *outlen)

{
  long lVar1;
  size_t sVar2;
  uchar *__ptr;
  uchar *puVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  uchar lookup [256];
  
  *outptr = (uchar *)0x0;
  *outlen = 0;
  sVar2 = strlen(src);
  if ((sVar2 & 3) == 0 && sVar2 != 0) {
    lVar8 = 0;
    do {
      if (src[lVar8 + (sVar2 - 1)] != '=') {
        lVar1 = (sVar2 >> 2) * 3;
        __ptr = (uchar *)malloc(lVar8 + lVar1 + 1);
        if (__ptr == (uchar *)0x0) {
          return CURLE_OUT_OF_MEMORY;
        }
        memset(lookup,0xff,0x100);
        memcpy(lookup + 0x2b,decodetable,0x50);
        puVar3 = __ptr;
        for (lVar4 = 0; lVar4 != ((sVar2 >> 2) - 1) + (ulong)(lVar8 == 0); lVar4 = lVar4 + 1) {
          uVar5 = 0;
          for (lVar7 = 0; (int)lVar7 != 4; lVar7 = lVar7 + 1) {
            if (lookup[(byte)src[lVar7]] == 0xff) goto LAB_0011f90e;
            uVar5 = uVar5 << 6 | (uint)lookup[(byte)src[lVar7]];
          }
          *(ushort *)(puVar3 + 1) = (ushort)uVar5 << 8 | (ushort)uVar5 >> 8;
          *puVar3 = (uchar)(uVar5 >> 0x10);
          puVar3 = puVar3 + 3;
          src = src + 4;
        }
        if (lVar8 != 0) {
          uVar5 = 0;
          uVar6 = 0;
          for (lVar4 = 0; (int)lVar4 != 4; lVar4 = lVar4 + 1) {
            if ((ulong)(byte)src[lVar4] == 0x3d) {
              uVar6 = uVar6 + 1;
              if ((ulong)-lVar8 < uVar6) {
LAB_0011f90e:
                free(__ptr);
                return CURLE_BAD_CONTENT_ENCODING;
              }
              uVar5 = uVar5 << 6;
            }
            else {
              if (lookup[(byte)src[lVar4]] == 0xff) goto LAB_0011f90e;
              uVar5 = uVar5 << 6 | (uint)lookup[(byte)src[lVar4]];
            }
          }
          if (lVar8 == -1) {
            puVar3[1] = (uchar)(uVar5 >> 8);
          }
          *puVar3 = (uchar)(uVar5 >> 0x10);
          puVar3 = puVar3 + lVar8 + 3;
        }
        *puVar3 = '\0';
        *outptr = __ptr;
        *outlen = lVar1 + lVar8;
        return CURLE_OK;
      }
      lVar8 = lVar8 + -1;
    } while (lVar8 != -3);
  }
  return CURLE_BAD_CONTENT_ENCODING;
}

Assistant:

CURLcode Curl_base64_decode(const char *src,
                            unsigned char **outptr, size_t *outlen)
{
  size_t srclen = 0;
  size_t padding = 0;
  size_t i;
  size_t numQuantums;
  size_t fullQuantums;
  size_t rawlen = 0;
  unsigned char *pos;
  unsigned char *newstr;
  unsigned char lookup[256];

  *outptr = NULL;
  *outlen = 0;
  srclen = strlen(src);

  /* Check the length of the input string is valid */
  if(!srclen || srclen % 4)
    return CURLE_BAD_CONTENT_ENCODING;

  /* srclen is at least 4 here */
  while(src[srclen - 1 - padding] == '=') {
    /* count padding characters */
    padding++;
    /* A maximum of two = padding characters is allowed */
    if(padding > 2)
      return CURLE_BAD_CONTENT_ENCODING;
  }

  /* Calculate the number of quantums */
  numQuantums = srclen / 4;
  fullQuantums = numQuantums - (padding ? 1 : 0);

  /* Calculate the size of the decoded string */
  rawlen = (numQuantums * 3) - padding;

  /* Allocate our buffer including room for a null-terminator */
  newstr = malloc(rawlen + 1);
  if(!newstr)
    return CURLE_OUT_OF_MEMORY;

  pos = newstr;

  memset(lookup, 0xff, sizeof(lookup));
  memcpy(&lookup['+'], decodetable, sizeof(decodetable));
  /* replaces
  {
    unsigned char c;
    const unsigned char *p = (const unsigned char *)base64encdec;
    for(c = 0; *p; c++, p++)
      lookup[*p] = c;
  }
  */

  /* Decode the complete quantums first */
  for(i = 0; i < fullQuantums; i++) {
    unsigned char val;
    unsigned int x = 0;
    int j;

    for(j = 0; j < 4; j++) {
      val = lookup[(unsigned char)*src++];
      if(val == 0xff) /* bad symbol */
        goto bad;
      x = (x << 6) | val;
    }
    pos[2] = x & 0xff;
    pos[1] = (x >> 8) & 0xff;
    pos[0] = (x >> 16) & 0xff;
    pos += 3;
  }
  if(padding) {
    /* this means either 8 or 16 bits output */
    unsigned char val;
    unsigned int x = 0;
    int j;
    size_t padc = 0;
    for(j = 0; j < 4; j++) {
      if(*src == '=') {
        x <<= 6;
        src++;
        if(++padc > padding)
          /* this is a badly placed '=' symbol! */
          goto bad;
      }
      else {
        val = lookup[(unsigned char)*src++];
        if(val == 0xff) /* bad symbol */
          goto bad;
        x = (x << 6) | val;
      }
    }
    if(padding == 1)
      pos[1] = (x >> 8) & 0xff;
    pos[0] = (x >> 16) & 0xff;
    pos += 3 - padding;
  }

  /* Zero terminate */
  *pos = '\0';

  /* Return the decoded data */
  *outptr = newstr;
  *outlen = rawlen;

  return CURLE_OK;
bad:
  free(newstr);
  return CURLE_BAD_CONTENT_ENCODING;
}